

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O0

Aig_Obj_t * Ssw_ObjChild1Fra(Ssw_Man_t *p,Aig_Obj_t *pObj,int i)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_28;
  int i_local;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin1(pObj);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      local_28 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Aig_ObjFanin1(pObj);
      pAVar2 = Ssw_ObjFrame(p,pAVar2,i);
      iVar1 = Aig_ObjFaninC1(pObj);
      local_28 = Aig_NotCond(pAVar2,iVar1);
    }
    return local_28;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswInt.h"
                ,0xba,"Aig_Obj_t *Ssw_ObjChild1Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Ssw_ObjChild1Fra( Ssw_Man_t * p, Aig_Obj_t * pObj, int i ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin1(pObj)? Aig_NotCond(Ssw_ObjFrame(p, Aig_ObjFanin1(pObj), i), Aig_ObjFaninC1(pObj)) : NULL;  }